

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void AddFontStyles(TidyDocImpl *doc,Node *node,AttVal *av)

{
  char cVar1;
  Attribute *pAVar2;
  byte bVar3;
  int iVar4;
  tmbstr ptVar5;
  char *s1;
  char *pcVar6;
  undefined1 *puVar7;
  size_t count;
  bool bVar8;
  tmbchar buf [256];
  tmbchar atStack_138 [264];
  
  if (av != (AttVal *)0x0) {
    do {
      s1 = av->value;
      if ((s1 != (ctmbstr)0x0) && (pAVar2 = av->dict, pAVar2 != (Attribute *)0x0)) {
        if (pAVar2->id == TidyAttr_FACE) {
          count = 0x100;
          pcVar6 = "font-family: %s";
LAB_0013c39b:
          prvTidytmbsnprintf(atStack_138,count,pcVar6,s1);
          prvTidyAddStyleProperty(doc,node,atStack_138);
        }
        else if (pAVar2 != (Attribute *)0x0) {
          if (pAVar2->id == TidyAttr_SIZE) {
            if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
               (node->tag->id == TidyTag_P)) {
              iVar4 = prvTidytmbstrcmp(s1,"6");
              if (iVar4 == 0) {
                bVar8 = false;
                pcVar6 = "h1";
              }
              else {
                iVar4 = prvTidytmbstrcmp(s1,"5");
                if (iVar4 == 0) {
                  bVar8 = false;
                  pcVar6 = "h2";
                }
                else {
                  iVar4 = prvTidytmbstrcmp(s1,"4");
                  bVar8 = iVar4 != 0;
                  pcVar6 = "h3";
                  if (bVar8) {
                    pcVar6 = (ctmbstr)0x0;
                  }
                }
              }
              if (!bVar8) {
                (*doc->allocator->vtbl->free)(doc->allocator,node->element);
                ptVar5 = prvTidytmbstrdup(doc->allocator,pcVar6);
                node->element = ptVar5;
                prvTidyFindTag(doc,node);
                goto LAB_0013c50a;
              }
            }
            cVar1 = *s1;
            if (cVar1 == '\0') {
              s1 = (ctmbstr)0x0;
            }
            else {
              bVar3 = cVar1 - 0x30;
              puVar7 = FontSize2Name_sizes;
              if (6 < bVar3) {
                bVar3 = s1[1] - 0x30;
                puVar7 = FontSize2Name_plussizes;
                if (cVar1 == '-') {
                  puVar7 = FontSize2Name_minussizes;
                }
                s1 = "larger";
                if (cVar1 == '-') {
                  s1 = "smaller";
                }
                if (6 < bVar3) goto LAB_0013c4bf;
              }
              s1 = *(char **)(puVar7 + (ulong)bVar3 * 8);
            }
LAB_0013c4bf:
            if (s1 != (ctmbstr)0x0) {
              count = 0x40;
              pcVar6 = "font-size: %s";
              goto LAB_0013c39b;
            }
          }
          else if ((pAVar2 != (Attribute *)0x0) && (pAVar2->id == TidyAttr_COLOR)) {
            count = 0x80;
            pcVar6 = "color: %s";
            goto LAB_0013c39b;
          }
        }
      }
LAB_0013c50a:
      av = av->next;
    } while (av != (AttVal *)0x0);
  }
  return;
}

Assistant:

static void AddFontStyles( TidyDocImpl* doc, Node *node, AttVal *av)
{
    while (av)
    {
        if (AttrHasValue(av))
        {
            if (attrIsFACE(av))
                AddFontFace( doc, node, av->value );
            else if (attrIsSIZE(av))
                AddFontSize( doc, node, av->value );
            else if (attrIsCOLOR(av))
                AddFontColor( doc, node, av->value );
        }
        av = av->next;
    }
}